

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_posfix(FuncState *fs,BinOpr op,expdesc *e1,expdesc *e2,int line)

{
  Instruction *pIVar1;
  uint uVar2;
  anon_union_8_4_e6d17769_for_u aVar3;
  undefined4 uVar4;
  int iVar5;
  int *l1;
  OpCode op_00;
  Instruction i;
  
  switch(op) {
  case OPR_ADD:
  case OPR_SUB:
  case OPR_MUL:
  case OPR_MOD:
  case OPR_POW:
  case OPR_DIV:
  case OPR_IDIV:
  case OPR_BAND:
  case OPR_BOR:
  case OPR_BXOR:
  case OPR_SHL:
  case OPR_SHR:
    iVar5 = constfolding(fs,op,e1,e2);
    if (iVar5 == 0) {
      op_00 = op + OPR_EQ;
LAB_0011fad1:
      codebinexpval(fs,op_00,e1,e2,line);
      return;
    }
    break;
  case OPR_CONCAT:
    luaK_exp2val(fs,e2);
    if ((e2->k != VRELOCABLE) || (pIVar1 = fs->f->code, (pIVar1[(e2->u).info] & 0x3f) != 0x1d)) {
      luaK_exp2nextreg(fs,e2);
      op_00 = OP_CONCAT;
      goto LAB_0011fad1;
    }
    if (((e1->k == VNONRELOC) && (((uint)(e1->u).info >> 8 & 1) == 0)) &&
       ((int)(uint)fs->nactvar <= (e1->u).info)) {
      fs->freereg = fs->freereg + 0xff;
    }
    pIVar1[(e2->u).info] = (e1->u).info << 0x17 | pIVar1[(e2->u).info] & 0x7fffff;
    e1->k = VRELOCABLE;
    (e1->u).info = (e2->u).info;
    break;
  case OPR_EQ:
  case OPR_LT:
  case OPR_LE:
  case OPR_NE:
  case OPR_GT:
  case OPR_GE:
    uVar2 = (e1->u).info | 0x100;
    if (e1->k != VK) {
      uVar2 = (e1->u).info;
    }
    iVar5 = luaK_exp2RK(fs,e2);
    freeexps(fs,e1,e2);
    if (op - OPR_GT < 2) {
      i = uVar2 << 0xe | iVar5 << 0x17 | op + OPR_LE | 0x40;
    }
    else if (op == OPR_NE) {
      i = iVar5 << 0xe | uVar2 << 0x17 | 0x1f;
    }
    else {
      i = iVar5 << 0xe | op + OPR_GE | uVar2 << 0x17 | 0x40;
    }
    luaK_code(fs,i);
    iVar5 = luaK_jump(fs);
    (e1->u).info = iVar5;
    e1->k = VJMP;
    break;
  case OPR_AND:
    luaK_dischargevars(fs,e2);
    l1 = &e2->f;
    iVar5 = e1->f;
    goto LAB_0011fc1f;
  case OPR_OR:
    luaK_dischargevars(fs,e2);
    l1 = &e2->t;
    iVar5 = e1->t;
LAB_0011fc1f:
    luaK_concat(fs,l1,iVar5);
    iVar5 = e2->f;
    e1->t = e2->t;
    e1->f = iVar5;
    uVar4 = *(undefined4 *)&e2->field_0x4;
    aVar3 = e2->u;
    e1->k = e2->k;
    *(undefined4 *)&e1->field_0x4 = uVar4;
    e1->u = aVar3;
  }
  return;
}

Assistant:

void luaK_posfix(FuncState *fs, BinOpr op,
                 expdesc *e1, expdesc *e2, int line) {
    switch (op) {
        case OPR_AND: {
            lua_assert(e1->t == NO_JUMP);  /* list closed by 'luK_infix' */
            luaK_dischargevars(fs, e2);
            luaK_concat(fs, &e2->f, e1->f);
            *e1 = *e2;
            break;
        }
        case OPR_OR: {
            lua_assert(e1->f == NO_JUMP);  /* list closed by 'luK_infix' */
            luaK_dischargevars(fs, e2);
            luaK_concat(fs, &e2->t, e1->t);
            *e1 = *e2;
            break;
        }
        case OPR_CONCAT: {
            luaK_exp2val(fs, e2);
            if (e2->k == VRELOCABLE &&
                GET_OPCODE(getinstruction(fs, e2)) == OP_CONCAT) {
                lua_assert(e1->u.info == GETARG_B(getinstruction(fs, e2)) - 1);
                freeexp(fs, e1);
                SETARG_B(getinstruction(fs, e2), e1->u.info);
                e1->k = VRELOCABLE;
                e1->u.info = e2->u.info;
            } else {
                luaK_exp2nextreg(fs, e2);  /* operand must be on the 'stack' */
                codebinexpval(fs, OP_CONCAT, e1, e2, line);
            }
            break;
        }
        case OPR_ADD:
        case OPR_SUB:
        case OPR_MUL:
        case OPR_DIV:
        case OPR_IDIV:
        case OPR_MOD:
        case OPR_POW:
        case OPR_BAND:
        case OPR_BOR:
        case OPR_BXOR:
        case OPR_SHL:
        case OPR_SHR: {
            if (!constfolding(fs, op + LUA_OPADD, e1, e2))
                codebinexpval(fs, cast(OpCode, op + OP_ADD), e1, e2, line);
            break;
        }
        case OPR_EQ:
        case OPR_LT:
        case OPR_LE:
        case OPR_NE:
        case OPR_GT:
        case OPR_GE: {
            codecomp(fs, op, e1, e2);
            break;
        }
        default:
            lua_assert(0);
    }
}